

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O3

int nghttp2_frame_pack_goaway(nghttp2_bufs *bufs,nghttp2_goaway *frame)

{
  uint8_t **ppuVar1;
  nghttp2_buf_chain *pnVar2;
  int iVar3;
  uint8_t *puVar4;
  
  pnVar2 = bufs->head;
  if (pnVar2 != bufs->cur) {
    __assert_fail("bufs->head == bufs->cur",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                  ,0x278,"int nghttp2_frame_pack_goaway(nghttp2_bufs *, nghttp2_goaway *)");
  }
  puVar4 = (pnVar2->buf).pos + -9;
  (pnVar2->buf).pos = puVar4;
  nghttp2_frame_pack_frame_hd(puVar4,&frame->hd);
  nghttp2_put_uint32be((pnVar2->buf).last,frame->last_stream_id);
  puVar4 = (pnVar2->buf).last + 4;
  (pnVar2->buf).last = puVar4;
  nghttp2_put_uint32be(puVar4,frame->error_code);
  ppuVar1 = &(pnVar2->buf).last;
  *ppuVar1 = *ppuVar1 + 4;
  iVar3 = nghttp2_bufs_add(bufs,frame->opaque_data,frame->opaque_data_len);
  if (iVar3 == -0x1f6) {
    iVar3 = -0x20a;
  }
  return iVar3;
}

Assistant:

int nghttp2_frame_pack_goaway(nghttp2_bufs *bufs, nghttp2_goaway *frame) {
  int rv;
  nghttp2_buf *buf;

  assert(bufs->head == bufs->cur);

  buf = &bufs->head->buf;

  buf->pos -= NGHTTP2_FRAME_HDLEN;

  nghttp2_frame_pack_frame_hd(buf->pos, &frame->hd);

  nghttp2_put_uint32be(buf->last, (uint32_t)frame->last_stream_id);
  buf->last += 4;

  nghttp2_put_uint32be(buf->last, frame->error_code);
  buf->last += 4;

  rv = nghttp2_bufs_add(bufs, frame->opaque_data, frame->opaque_data_len);

  if (rv == NGHTTP2_ERR_BUFFER_ERROR) {
    return NGHTTP2_ERR_FRAME_SIZE_ERROR;
  }

  if (rv != 0) {
    return rv;
  }

  return 0;
}